

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * cmSystemTools::ConvertToOutputPath(string *__return_storage_ptr__,string *path)

{
  string *path_local;
  
  cmsys::SystemTools::ConvertToUnixOutputPath(__return_storage_ptr__,path);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::ConvertToOutputPath(std::string const& path)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  if (s_ForceUnixPaths) {
    return cmSystemTools::ConvertToUnixOutputPath(path);
  }
  return cmSystemTools::ConvertToWindowsOutputPath(path);
#else
  return cmSystemTools::ConvertToUnixOutputPath(path);
#endif
}